

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

optional<grammar> * grammar::parse_from_file(optional<grammar> *__return_storage_ptr__,string *data)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  token_t nonterm;
  const_iterator iter;
  anon_class_8_1_2eca9639 error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> symbol_1;
  anon_class_16_2_3f493c2b consume_whitespace;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> symbol;
  size_t line_num;
  string nonterm_symbol;
  anon_class_24_3_610413f5 consume_symbol;
  grammar to_ret;
  symbol_t temp_sym;
  strong_t<int,_grammar::token_tag> local_1cc;
  const_iterator local_1c8;
  strong_t<int,_grammar::token_tag> local_1bc;
  optional<grammar> *local_1b8;
  anon_class_8_1_2eca9639 local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  anon_class_16_2_3f493c2b local_188;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_178;
  char local_158;
  size_t local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [16];
  _Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  local_128;
  const_iterator *local_110;
  string *local_108;
  anon_class_16_2_3f493c2b *local_100;
  undefined1 local_f8 [48];
  _Rb_tree_impl<std::less<strong_t<int,_grammar::token_tag>_>,_true> local_c8;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_c8.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_c8.super__Rb_tree_header._M_node_count = 0;
  local_c8.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_c8._0_8_ = 0;
  local_c8.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.super__Rb_tree_header._M_header._4_4_ = 0;
  local_f8._32_8_ = (_Base_ptr)0x0;
  local_f8._40_8_ = 0;
  local_f8._16_8_ = (_Base_ptr)0x0;
  local_f8._24_8_ = (_Base_ptr)0x0;
  local_f8._0_8_ = 0;
  local_f8._8_8_ = 0;
  local_1b8 = __return_storage_ptr__;
  grammar((grammar *)local_f8);
  pcVar6 = (data->_M_dataplus)._M_p;
  local_1cc.internal_rep = 0;
  local_188.iter = &local_1c8;
  local_148 = local_138;
  local_140 = 0;
  local_138[0] = 0;
  local_1b0.line_num = &local_150;
  local_150 = 1;
  local_100 = &local_188;
  local_1c8._M_current = pcVar6;
  local_188.data = data;
  local_110 = local_188.iter;
  local_108 = data;
  while (local_1c8._M_current < pcVar6 + data->_M_string_length) {
    parse_from_file::anon_class_16_2_3f493c2b::operator()(&local_188);
    if ((data->_M_dataplus)._M_p + data->_M_string_length <= local_1c8._M_current) break;
    parse_from_file(std::__cxx11::string_const&)::$_2::operator()[abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_178._M_value,&local_110);
    if (local_158 != '\x01') {
LAB_0010410d:
      poVar5 = parse_from_file::anon_class_8_1_2eca9639::operator()(&local_1b0);
      poVar5 = std::operator<<(poVar5,"Cannot use ");
      poVar5 = std::operator<<(poVar5,*local_1c8._M_current);
      std::operator<<(poVar5,
                      " as a nonterminal\nNonterminals must either be capitalized or surrounded with <>\n"
                     );
      (local_1b8->super__Optional_base<grammar,_false,_false>)._M_payload.
      super__Optional_payload<grammar,_true,_false,_false>.super__Optional_payload_base<grammar>.
      _M_engaged = false;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178._M_value);
      goto LAB_001040b5;
    }
    cVar1 = *(char *)local_178._M_value._M_dataplus._M_p;
    iVar4 = isupper((int)cVar1);
    if ((cVar1 != 0x3c) && (iVar4 == 0)) goto LAB_0010410d;
    std::__cxx11::string::_M_assign((string *)&local_148);
    std::__cxx11::string::string(local_50,(string *)&local_148);
    std::__cxx11::string::string((string *)&local_1a8,local_50);
    local_1cc.internal_rep = (int)get_nonterminal((grammar *)local_f8,(symbol_t *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string(local_50);
    poVar5 = std::operator<<((ostream *)&std::cout,"Using token ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_1cc.internal_rep);
    poVar5 = std::operator<<(poVar5," for nonterminal ");
    poVar5 = std::operator<<(poVar5,(string *)&local_148);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_178._M_value);
    parse_from_file::anon_class_16_2_3f493c2b::operator()(&local_188);
    bVar3 = false;
    for (; (local_1c8._M_current != (data->_M_dataplus)._M_p + data->_M_string_length &&
           (*local_1c8._M_current == '-')); local_1c8._M_current = local_1c8._M_current + 1) {
      bVar3 = true;
    }
    if (!bVar3) {
      poVar5 = parse_from_file::anon_class_8_1_2eca9639::operator()(&local_1b0);
      poVar5 = std::operator<<(poVar5,"Expected some hyphens after nonterminal ");
      poVar5 = std::operator<<(poVar5,(string *)&local_148);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    parse_from_file::anon_class_16_2_3f493c2b::operator()(&local_188);
    local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      if (((data->_M_dataplus)._M_p + data->_M_string_length <= local_1c8._M_current) ||
         (*local_1c8._M_current == ';')) break;
      parse_from_file(std::__cxx11::string_const&)::$_2::operator()[abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178._M_value,&local_110);
      cVar1 = local_158;
      if (local_158 == '\x01') {
        std::__cxx11::string::string((string *)&local_1a8,(string *)&local_178._M_value);
        rule_sep_char_abi_cxx11_();
        bVar3 = operator==(&local_1a8,(this_t *)local_90);
        std::__cxx11::string::~string(local_90);
        if (bVar3) {
          std::
          vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
          ::push_back((vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                       *)&local_128,&rule_sep);
        }
        else {
          std::__cxx11::string::string(local_70,(string *)&local_1a8);
          std::__cxx11::string::string(local_90,local_70);
          std::__cxx11::string::~string(local_70);
          cVar2 = *local_1a8._M_dataplus._M_p;
          iVar4 = isupper((int)cVar2);
          if ((cVar2 == 0x3c) || (iVar4 != 0)) {
            local_1bc.internal_rep = (int)get_nonterminal((grammar *)local_f8,(symbol_t *)local_90);
            std::
            vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
            ::emplace_back<strong_t<int,grammar::token_tag>>
                      ((vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                        *)&local_128,&local_1bc);
          }
          else {
            local_1bc.internal_rep = (int)get_terminal((grammar *)local_f8,(symbol_t *)local_90);
            std::
            vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
            ::emplace_back<strong_t<int,grammar::token_tag>>
                      ((vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                        *)&local_128,&local_1bc);
          }
          std::__cxx11::string::~string(local_90);
        }
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      else {
        poVar5 = parse_from_file::anon_class_8_1_2eca9639::operator()(&local_1b0);
        poVar5 = std::operator<<(poVar5,"Could not consume next symbol in production for ");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_1cc.internal_rep);
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"Successfully parsed the following:");
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_1a8,(data->_M_dataplus)._M_p,local_1c8._M_current);
        poVar5 = std::operator<<(poVar5,(string *)&local_1a8);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&local_1a8);
        (local_1b8->super__Optional_base<grammar,_false,_false>)._M_payload.
        super__Optional_payload<grammar,_true,_false,_false>.super__Optional_payload_base<grammar>.
        _M_engaged = false;
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178._M_value);
      if (cVar1 == '\0') {
        std::
        _Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
        ::~_Vector_base(&local_128);
        goto LAB_001040b5;
      }
      parse_from_file::anon_class_16_2_3f493c2b::operator()(&local_188);
    }
    std::
    _Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>>>
    ::
    _M_emplace_unique<strong_t<int,grammar::token_tag>&,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>
              ((_Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,std::vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>>>>
                *)&local_c8,&local_1cc,
               (vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                *)&local_128);
    local_1c8._M_current = local_1c8._M_current + 1;
    local_150 = local_150 + 1;
    std::
    _Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
    ::~_Vector_base(&local_128);
    pcVar6 = (data->_M_dataplus)._M_p;
  }
  std::operator<<((ostream *)&std::cout,"Successfully parsed grammar\n");
  std::optional<grammar>::optional<grammar,_true>(local_1b8,(grammar *)local_f8);
LAB_001040b5:
  std::__cxx11::string::~string((string *)&local_148);
  ~grammar((grammar *)local_f8);
  return local_1b8;
}

Assistant:

std::optional<grammar> grammar::parse_from_file(const std::string & data) {
    grammar     to_ret{};
    auto        iter = data.begin();
    token_t     nonterm{0};
    std::string nonterm_symbol;
    size_t      line_num = 1;

    const auto consume_whitespace = [&iter, &data] {
        while (iter != data.end() and isspace(*iter)) iter++;
    };

    const auto error = [&line_num]() -> std::ostream & {
        return std::cerr << "Line " << std::setw(2) << line_num << " : ";
    };

    const auto consume_symbol
        = [&iter, &data, &consume_whitespace]() -> std::optional<std::string> {
        if (std::string symbol; iter != data.end()) {
            consume_whitespace();

            if (*iter == '<') {
                // time to eat a whole symbol
                do {
                    symbol += *iter;
                    ++iter;

                    if (*iter == '<' or *iter == ';'
                        or *iter == grammar::rule_sep or *iter == '\n') {
                        std::cerr << "Cannot use ';', '<', '|', or newline in "
                                     "a symbol "
                                     "name\nOffending name:"
                                  << symbol << std::endl;
                        return std::optional<std::string>{};
                    }
                } while (*iter != '>');

                // Append the '>'
                iter++;
                symbol += '>';
                return std::optional{symbol};
            } else {
                auto sym = *iter;
                iter++;
                return std::optional{std::string(1, sym)};
            }
        }

        std::cerr << "Unexpected end of file" << std::endl;
        return std::optional<std::string>{};
    };

    while (iter < data.end()) {
        // Remove initial whitespace
        consume_whitespace();
        if (iter >= data.end()) break;

        // Read initial symbol
        if (auto symbol = consume_symbol();
            symbol
            and (isupper(symbol.value().front())
                 or symbol.value().front() == '<')) {
            nonterm_symbol = symbol.value();
            nonterm        = to_ret.get_nonterminal(symbol_t{nonterm_symbol});
            std::cout << "Using token " << nonterm << " for nonterminal "
                      << nonterm_symbol << std::endl;
        } else {
            error() << "Cannot use " << *iter
                    << " as a nonterminal\nNonterminals must either be "
                       "capitalized or surrounded with <>\n";
            return std::optional<grammar>{};
        }

        // remove whitespace between symbol and hyphen
        consume_whitespace();

        // consume all hyphens
        bool ate_hyphen = false;
        while (iter != data.end() and *iter == '-') {
            iter++;
            ate_hyphen = true;
        }
        if (not ate_hyphen) {
            error() << "Expected some hyphens after nonterminal "
                    << nonterm_symbol << std::endl;
        }

        // remove whitespace
        consume_whitespace();

        rule_t rule_list{};

        // Go to the end of the line
        // consuming the rest of the line as the rule
        while (iter < data.end() and *iter != ';') {
            if (auto sym = consume_symbol(); sym) {
                if (auto symbol = sym.value(); symbol == rule_sep_char())
                    rule_list.push_back(rule_sep);
                else if (symbol_t temp_sym{symbol};
                         isupper(symbol.front()) or symbol.front() == '<')
                    rule_list.push_back(to_ret.get_nonterminal(temp_sym));
                else
                    rule_list.push_back(to_ret.get_terminal(temp_sym));
            } else {
                error() << "Could not consume next symbol in production for "
                        << nonterm << std::endl
                        << "Successfully parsed the following:"
                        << std::string{data.begin(), iter} << std::endl;
                return std::optional<grammar>{};
            }
            consume_whitespace();
        }

        to_ret.rules.emplace(nonterm, std::move(rule_list));
        iter++;
        line_num++;
    }

    std::cout << "Successfully parsed grammar\n";
    return to_ret;
}